

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void SetWindowIcons(Image *images,int count)

{
  undefined8 uVar1;
  GLFWimage *images_00;
  long lVar2;
  int count_00;
  
  if (images == (Image *)0x0 || count < 1) {
    glfwSetWindowIcon(platform.handle,0,(GLFWimage *)0x0);
    return;
  }
  images_00 = (GLFWimage *)calloc((ulong)(uint)count,0x10);
  count_00 = 0;
  for (lVar2 = 0; (ulong)(uint)count * 0x18 - lVar2 != 0; lVar2 = lVar2 + 0x18) {
    if (*(int *)((long)&images->format + lVar2) == 7) {
      uVar1 = *(undefined8 *)((long)&images->width + lVar2);
      images_00[count_00].width = (int)uVar1;
      images_00[count_00].height = (int)((ulong)uVar1 >> 0x20);
      images_00[count_00].pixels = *(uchar **)((long)&images->data + lVar2);
      count_00 = count_00 + 1;
    }
    else {
      TraceLog(4,"GLFW: Window icon image must be in R8G8B8A8 pixel format");
    }
  }
  glfwSetWindowIcon(platform.handle,count_00,images_00);
  free(images_00);
  return;
}

Assistant:

void SetWindowIcons(Image *images, int count)
{
    if ((images == NULL) || (count <= 0))
    {
        // Revert to the default window icon, pass in an empty image array
        glfwSetWindowIcon(platform.handle, 0, NULL);
    }
    else
    {
        int valid = 0;
        GLFWimage *icons = RL_CALLOC(count, sizeof(GLFWimage));

        for (int i = 0; i < count; i++)
        {
            if (images[i].format == PIXELFORMAT_UNCOMPRESSED_R8G8B8A8)
            {
                icons[valid].width = images[i].width;
                icons[valid].height = images[i].height;
                icons[valid].pixels = (unsigned char *)images[i].data;

                valid++;
            }
            else TRACELOG(LOG_WARNING, "GLFW: Window icon image must be in R8G8B8A8 pixel format");
        }
        // NOTE: Images data is copied internally before this function returns
        glfwSetWindowIcon(platform.handle, valid, icons);

        RL_FREE(icons);
    }
}